

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O1

void lts2::ProxProjectOntoUnitSimplex(float *X,int n,int step)

{
  ulong __n;
  bool bVar1;
  void *__s;
  int iVar2;
  int iVar3;
  float *pfVar4;
  ulong uVar5;
  float mu;
  float fVar6;
  float fVar7;
  float fVar8;
  
  __n = (ulong)(uint)n;
  __s = operator_new__((long)n);
  if (0 < n) {
    memset(__s,0xff,__n);
    iVar2 = 0;
    do {
      uVar5 = 0;
      iVar3 = 0;
      fVar6 = 0.0;
      pfVar4 = X;
      do {
        if (*(char *)((long)__s + uVar5) != '\0') {
          fVar6 = fVar6 + *pfVar4;
          iVar3 = iVar3 + 1;
        }
        uVar5 = uVar5 + 1;
        pfVar4 = pfVar4 + step;
      } while (__n != uVar5);
      bVar1 = true;
      uVar5 = 0;
      pfVar4 = X;
      do {
        if (*(char *)((long)__s + uVar5) == '\0') {
          fVar7 = 0.0;
        }
        else {
          fVar7 = *pfVar4 - (fVar6 + -1.0) / (float)iVar3;
        }
        fVar8 = 0.0;
        if (0.0 <= fVar7) {
          fVar8 = fVar7;
        }
        *pfVar4 = fVar8;
        if (fVar7 < 0.0) {
          *(undefined1 *)((long)__s + uVar5) = 0;
          bVar1 = false;
        }
        uVar5 = uVar5 + 1;
        pfVar4 = pfVar4 + step;
      } while (__n != uVar5);
    } while ((!bVar1) && (iVar2 = iVar2 + 1, iVar2 < n));
  }
  operator_delete__(__s);
  return;
}

Assistant:

void lts2::ProxProjectOntoUnitSimplex(float* X, int n, int step)
{
  unsigned char* In_complement = new unsigned char[n];
  for (int i = 0; i < n; ++i)
    In_complement[i] = 255;
    
  float* Xtilda = new float[n];
        
  // Iterate
  bool success = false;
  int iterationCount = 0;
  while ( !success && iterationCount < n ) 
  {
    success = true;
        
    // Compute the mean used to project onto V_I
    float mu = 0.0;
    int nonZero = 0;
    for (int i = 0; i < n; ++i)
      if ( In_complement[i] > 0 )
      {
        mu += X[i*step];
        ++nonZero;
      }
    mu -= 1.0;
    mu /= nonZero;
    
    // Compute projections onto V_I and X_I together
    // Note that we can test at the same time the convergence:
    // we have converged when all the components of X tilda are positive.
    for (int i = 0; i < n; ++i)
    {
      // Projection onto V_I : enforce the summation to 1
      if ( In_complement[i] > 0 )
        Xtilda[i] = X[i*step] - mu;
      else
        Xtilda[i] = 0.0;
            
      // Projection onto X_I : enforce the positivity
      X[i*step] = MAX(Xtilda[i], 0.0);
            
      // Convergence check
      if ( Xtilda[i] < 0.0 )
      {
        In_complement[i] = 0;
        success = false;
      }
    }
        
    ++iterationCount;
  }

    
  // Release memory
  delete []In_complement;
  delete []Xtilda;
}